

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lss_allocator.h
# Opt level: O0

uint32_t __thiscall
FASTER::core::lss_memory::ThreadAllocator::Reserve(ThreadAllocator *this,uint32_t block_size)

{
  uint uVar1;
  uint32_t result;
  uint32_t block_size_local;
  ThreadAllocator *this_local;
  
  if (8000 < block_size) {
    __assert_fail("block_size <= kSegmentSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.h"
                  ,0xb1,"uint32_t FASTER::core::lss_memory::ThreadAllocator::Reserve(uint32_t)");
  }
  this->allocations_ = this->allocations_ + 1;
  uVar1 = this->segment_offset_;
  if (uVar1 < 0x1f41) {
    this->segment_offset_ = block_size + this->segment_offset_;
    return uVar1;
  }
  __assert_fail("result <= kSegmentSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.h"
                ,0xb4,"uint32_t FASTER::core::lss_memory::ThreadAllocator::Reserve(uint32_t)");
}

Assistant:

inline uint32_t Reserve(uint32_t block_size) {
    assert(block_size <= kSegmentSize);
    ++allocations_;
    uint32_t result = segment_offset_;
    assert(result <= kSegmentSize);
    segment_offset_ += block_size;
    return result;
  }